

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_SPLICE(DisasContext_conflict1 *s,arg_rprr_esz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t cofs;
  uint vsz;
  TCGContext_conflict1 *tcg_ctx;
  arg_rprr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    oprsz = vec_full_reg_size(s);
    dofs = vec_full_reg_offset(s,a->rd);
    aofs = vec_full_reg_offset(s,a->rn);
    bofs = vec_full_reg_offset(s,a->rm);
    cofs = pred_full_reg_offset(s,a->pg);
    tcg_gen_gvec_4_ool_aarch64
              (tcg_ctx_00,dofs,aofs,bofs,cofs,oprsz,oprsz,a->esz,gen_helper_sve_splice);
  }
  return true;
}

Assistant:

static bool trans_SPLICE(DisasContext *s, arg_rprr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        unsigned vsz = vec_full_reg_size(s);
        tcg_gen_gvec_4_ool(tcg_ctx, vec_full_reg_offset(s, a->rd),
                           vec_full_reg_offset(s, a->rn),
                           vec_full_reg_offset(s, a->rm),
                           pred_full_reg_offset(s, a->pg),
                           vsz, vsz, a->esz, gen_helper_sve_splice);
    }
    return true;
}